

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

FOTerm * test_create_program(void)

{
  FOTerm *in_RDI;
  size_type in_R8;
  initializer_list<FOTerm> params;
  initializer_list<FOTerm> params_00;
  initializer_list<FOTerm> params_01;
  initializer_list<FOTerm> params_02;
  initializer_list<FOTerm> params_03;
  FOTerm *local_580;
  FOTerm *local_560;
  FOTerm *local_540;
  FOTerm *local_520;
  FOTerm local_4e0;
  FOTerm local_4a0;
  FOTerm local_460;
  undefined1 local_420 [24];
  undefined1 local_408 [40];
  FOTerm local_3e0;
  FOTerm local_3a0;
  undefined1 local_360 [24];
  undefined1 local_348 [40];
  FOTerm hYfa;
  FOTerm local_2e0;
  undefined1 local_2a0 [24];
  undefined1 local_288 [40];
  FOTerm fX;
  FOTerm local_220;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [40];
  FOTerm fa;
  iterator local_160;
  allocator local_151;
  undefined1 local_150 [40];
  FOTerm a;
  string local_e8 [32];
  undefined1 local_c8 [8];
  FOTerm Y;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  FOTerm X;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"X",&local_71);
  FOTerm::variable((FOTerm *)local_50,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Y",(allocator *)&a.field_0x3f);
  FOTerm::variable((FOTerm *)local_c8,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&a.field_0x3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"a",&local_151);
  std::initializer_list<FOTerm>::initializer_list((initializer_list<FOTerm> *)&fa.field_0x38);
  params._M_len = in_R8;
  params._M_array = local_160;
  FOTerm::functor((FOTerm *)(local_150 + 0x20),(FOTerm *)local_150,(string *)fa._56_8_,params);
  std::__cxx11::string::~string((string *)local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1c8,"f",(allocator *)(local_1e0 + 0x17));
  fX._56_8_ = &local_220;
  FOTerm::FOTerm((FOTerm *)fX._56_8_,(FOTerm *)(local_150 + 0x20));
  local_1e0._0_8_ = &local_220;
  local_1e0._8_8_ = (pointer)0x1;
  params_00._M_len = in_R8;
  params_00._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)(local_1c8 + 0x20),(FOTerm *)local_1c8,(string *)local_1e0._0_8_,
                  params_00);
  local_520 = (FOTerm *)local_1e0;
  do {
    local_520 = local_520 + -1;
    FOTerm::~FOTerm(local_520);
  } while (local_520 != &local_220);
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1e0 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_288,"f",(allocator *)(local_2a0 + 0x17));
  hYfa._56_8_ = &local_2e0;
  FOTerm::FOTerm((FOTerm *)hYfa._56_8_,(FOTerm *)local_50);
  local_2a0._0_8_ = &local_2e0;
  local_2a0._8_8_ = (pointer)0x1;
  params_01._M_len = in_R8;
  params_01._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)(local_288 + 0x20),(FOTerm *)local_288,(string *)local_2a0._0_8_,
                  params_01);
  local_540 = (FOTerm *)local_2a0;
  do {
    local_540 = local_540 + -1;
    FOTerm::~FOTerm(local_540);
  } while (local_540 != &local_2e0);
  std::__cxx11::string::~string((string *)local_288);
  std::allocator<char>::~allocator((allocator<char> *)(local_2a0 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_348,"h",(allocator *)(local_360 + 0x17));
  local_408._32_8_ = &local_3e0;
  FOTerm::FOTerm((FOTerm *)local_408._32_8_,(FOTerm *)local_c8);
  local_408._32_8_ = &local_3a0;
  FOTerm::FOTerm((FOTerm *)local_408._32_8_,(FOTerm *)(local_1c8 + 0x20));
  local_360._0_8_ = &local_3e0;
  local_360._8_8_ = (pointer)0x2;
  params_02._M_len = in_R8;
  params_02._M_array = (iterator)0x2;
  FOTerm::functor((FOTerm *)(local_348 + 0x20),(FOTerm *)local_348,(string *)local_360._0_8_,
                  params_02);
  local_560 = (FOTerm *)local_360;
  do {
    local_560 = local_560 + -1;
    FOTerm::~FOTerm(local_560);
  } while (local_560 != &local_3e0);
  std::__cxx11::string::~string((string *)local_348);
  std::allocator<char>::~allocator((allocator<char> *)(local_360 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_408,"p",(allocator *)(local_420 + 0x17));
  FOTerm::FOTerm(&local_4e0,(FOTerm *)(local_288 + 0x20));
  FOTerm::FOTerm(&local_4a0,(FOTerm *)(local_348 + 0x20));
  FOTerm::FOTerm(&local_460,(FOTerm *)local_c8);
  local_420._0_8_ = &local_4e0;
  local_420._8_8_ = (pointer)0x3;
  params_03._M_len = in_R8;
  params_03._M_array = (iterator)0x3;
  FOTerm::functor(in_RDI,(FOTerm *)local_408,(string *)local_420._0_8_,params_03);
  local_580 = (FOTerm *)local_420;
  do {
    local_580 = local_580 + -1;
    FOTerm::~FOTerm(local_580);
  } while (local_580 != &local_4e0);
  std::__cxx11::string::~string((string *)local_408);
  std::allocator<char>::~allocator((allocator<char> *)(local_420 + 0x17));
  FOTerm::~FOTerm((FOTerm *)(local_348 + 0x20));
  FOTerm::~FOTerm((FOTerm *)(local_288 + 0x20));
  FOTerm::~FOTerm((FOTerm *)(local_1c8 + 0x20));
  FOTerm::~FOTerm((FOTerm *)(local_150 + 0x20));
  FOTerm::~FOTerm((FOTerm *)local_c8);
  FOTerm::~FOTerm((FOTerm *)local_50);
  return in_RDI;
}

Assistant:

FOTerm test_create_program() {
    FOTerm X = FOTerm::variable("X");
    FOTerm Y = FOTerm::variable("Y");
    FOTerm a = FOTerm::functor("a", {});
    FOTerm fa = FOTerm::functor("f", {a});
    FOTerm fX = FOTerm::functor("f", {X});
    FOTerm hYfa = FOTerm::functor("h", {Y, fa});
    return FOTerm::functor("p", {fX, hYfa, Y});
}